

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

UBool __thiscall
icu_63::Normalizer2Impl::ensureCanonIterData(Normalizer2Impl *this,UErrorCode *errorCode)

{
  umtx_initOnce<icu_63::Normalizer2Impl*>
            (&this->fCanonIterDataInitOnce,initCanonIterData,this,errorCode);
  return *errorCode < U_ILLEGAL_ARGUMENT_ERROR;
}

Assistant:

UBool Normalizer2Impl::ensureCanonIterData(UErrorCode &errorCode) const {
    // Logically const: Synchronized instantiation.
    Normalizer2Impl *me=const_cast<Normalizer2Impl *>(this);
    umtx_initOnce(me->fCanonIterDataInitOnce, &initCanonIterData, me, errorCode);
    return U_SUCCESS(errorCode);
}